

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.h
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::
OP_ProfiledReturnTypeCallIExtendedFlags<Js::OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
          (InterpreterStackFrame *this,
          OpLayoutDynamicProfile<Js::OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>_>
          *playout)

{
  ProfileId profileId;
  CallFlags flags;
  Var value;
  RecyclableObject *function;
  AuxArray<unsigned_int> *spreadIndices;
  
  value = *(Var *)(this + (ulong)(playout->
                                 super_OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>
                                 ).
                                 super_OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>
                                 .super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>.
                                 Function * 8 + 0x160);
  ValidateRegValue(this,value,true,true);
  function = JavascriptOperators::GetCallableObjectOrThrow(value,*(ScriptContext **)(this + 0x78));
  flags = (playout->super_OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).
          callFlags;
  profileId = playout->profileId;
  if (((playout->super_OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).
       super_OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>.Options &
      CallIExtended_SpreadArgs) == CallIExtended_None) {
    spreadIndices = (AuxArray<unsigned_int> *)0x0;
  }
  else {
    spreadIndices =
         ByteCodeReader::ReadAuxArray<unsigned_int>
                   ((playout->
                    super_OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).
                    super_OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>.
                    SpreadAuxOffset,*(FunctionBody **)(this + 0x88));
  }
  OP_ProfileReturnTypeCallCommon<Js::OpLayoutDynamicProfile<Js::OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>__unaligned>
            (this,playout,function,flags,profileId,spreadIndices);
  return;
}

Assistant:

void OP_ProfiledReturnTypeCallIExtendedFlags(const unaligned OpLayoutDynamicProfile<T>* playout) { OP_ProfileReturnTypeCallCommon(playout, OP_CallGetFunc(GetRegAllowStackVar(playout->Function)),  playout->callFlags, playout->profileId, (playout->Options & CallIExtended_SpreadArgs) ? m_reader.ReadAuxArray<uint32>(playout->SpreadAuxOffset, this->GetFunctionBody()) : nullptr); }